

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precision.cpp
# Opt level: O0

void verify_accuracy_all<float,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                rng)

{
  initializer_list<distribution<float>_> __l;
  char *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined8 auStack_3c78 [314];
  ostream *local_32a8;
  undefined8 *local_32a0;
  float local_3294;
  ostream *local_3290;
  ostream *local_3288;
  undefined8 *local_3280;
  float local_3274;
  ostream *local_3270;
  ostream *local_3268;
  undefined8 *local_3260;
  float local_3254;
  ostream *local_3250;
  ostream *local_3248;
  undefined8 *local_3240;
  float local_3234;
  ostream *local_3230;
  ostream *local_3228;
  undefined8 *local_3220;
  float local_3214;
  ostream *local_3210;
  ostream *local_3208;
  ostream *local_3200;
  ostream *local_31f8;
  undefined1 *local_31f0;
  allocator_type *local_31e8;
  undefined8 local_31e0 [313];
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_2818;
  undefined8 local_2800 [313];
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_1e38;
  undefined8 local_1e20 [313];
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_1458;
  undefined8 local_1440 [313];
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_a78;
  undefined8 local_a60 [313];
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_98;
  allocator<distribution<float>_> local_69;
  distribution<float> local_68;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<distribution<float>,_std::allocator<distribution<float>_>_> dists;
  
  bVar5 = 0;
  local_31f0 = &stack0x00000008;
  local_48 = 10;
  uStack_40 = 0x3f800000;
  local_68.deviation = 1.0;
  local_68._20_4_ = 0;
  uStack_50 = 20000000;
  local_68.terms = 20000000;
  local_68.mean = 0;
  local_30 = &local_68;
  local_28 = 2;
  local_31e8 = &local_69;
  std::allocator<distribution<float>_>::allocator(local_31e8);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            ((vector<distribution<float>,_std::allocator<distribution<float>_>_> *)local_20,__l,
             local_31e8);
  std::allocator<distribution<float>_>::~allocator(&local_69);
  local_31f8 = std::operator<<((ostream *)&std::cout,"testing for ");
  pcVar1 = std::type_info::name((type_info *)&float::typeinfo);
  local_3200 = std::operator<<(local_31f8,pcVar1);
  local_3208 = std::operator<<(local_3200,":");
  std::ostream::operator<<(local_3208,std::endl<char,std::char_traits<char>>);
  local_3210 = std::operator<<((ostream *)&std::cout,"kahan:    ");
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_98,
             (vector<distribution<float>,_std::allocator<distribution<float>_>_> *)local_20);
  local_3220 = local_a60;
  memcpy(local_3220,local_31f0,0x9c8);
  puVar3 = local_3220;
  puVar4 = auStack_3c78;
  for (lVar2 = 0x139; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_3214 = verify_accuracy<float,sumlib::kahan,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                         (&local_98);
  local_3228 = (ostream *)std::ostream::operator<<(local_3210,local_3214);
  std::ostream::operator<<(local_3228,std::endl<char,std::char_traits<char>>);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::~vector(&local_98);
  local_3230 = std::operator<<((ostream *)&std::cout,"neumaier: ");
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_a78,
             (vector<distribution<float>,_std::allocator<distribution<float>_>_> *)local_20);
  local_3240 = local_1440;
  memcpy(local_3240,local_31f0,0x9c8);
  puVar3 = local_3240;
  puVar4 = auStack_3c78;
  for (lVar2 = 0x139; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_3234 = verify_accuracy<float,sumlib::neumaier,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                         (&local_a78);
  local_3248 = (ostream *)std::ostream::operator<<(local_3230,local_3234);
  std::ostream::operator<<(local_3248,std::endl<char,std::char_traits<char>>);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::~vector(&local_a78);
  local_3250 = std::operator<<((ostream *)&std::cout,"naive:    ");
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_1458,
             (vector<distribution<float>,_std::allocator<distribution<float>_>_> *)local_20);
  local_3260 = local_1e20;
  memcpy(local_3260,local_31f0,0x9c8);
  puVar3 = local_3260;
  puVar4 = auStack_3c78;
  for (lVar2 = 0x139; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_3254 = verify_accuracy<float,sumlib::naive,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                         (&local_1458);
  local_3268 = (ostream *)std::ostream::operator<<(local_3250,local_3254);
  std::ostream::operator<<(local_3268,std::endl<char,std::char_traits<char>>);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::~vector(&local_1458);
  local_3270 = std::operator<<((ostream *)&std::cout,"sorted:   ");
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_1e38,
             (vector<distribution<float>,_std::allocator<distribution<float>_>_> *)local_20);
  local_3280 = local_2800;
  memcpy(local_3280,local_31f0,0x9c8);
  puVar3 = local_3280;
  puVar4 = auStack_3c78;
  for (lVar2 = 0x139; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_3274 = verify_accuracy<float,sumlib::sorted,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                         (&local_1e38);
  local_3288 = (ostream *)std::ostream::operator<<(local_3270,local_3274);
  std::ostream::operator<<(local_3288,std::endl<char,std::char_traits<char>>);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::~vector(&local_1e38);
  local_3290 = std::operator<<((ostream *)&std::cout,"rsorted:  ");
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_2818,
             (vector<distribution<float>,_std::allocator<distribution<float>_>_> *)local_20);
  local_32a0 = local_31e0;
  memcpy(local_32a0,local_31f0,0x9c8);
  puVar3 = local_32a0;
  puVar4 = auStack_3c78;
  for (lVar2 = 0x139; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_3294 = verify_accuracy<float,sumlib::rsorted,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                         (&local_2818);
  local_32a8 = (ostream *)std::ostream::operator<<(local_3290,local_3294);
  std::ostream::operator<<(local_32a8,std::endl<char,std::char_traits<char>>);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::~vector(&local_2818);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::~vector
            ((vector<distribution<float>,_std::allocator<distribution<float>_>_> *)local_20);
  return;
}

Assistant:

void verify_accuracy_all( RNG rng ) {
    const vector<distribution<T>> dists = {
        {20*1000*1000, 0, 1},
        {20*1000*1000, 10, 1},
    };

    cout << "testing for " << typeid(T).name() << ":" << endl;
    cout << "kahan:    " << verify_accuracy<T, kahan>   ( dists, rng ) << endl;
    cout << "neumaier: " << verify_accuracy<T, neumaier>( dists, rng ) << endl;
    cout << "naive:    " << verify_accuracy<T, naive>   ( dists, rng ) << endl;
    cout << "sorted:   " << verify_accuracy<T, sorted>  ( dists, rng ) << endl;
    cout << "rsorted:  " << verify_accuracy<T, rsorted> ( dists, rng ) << endl;

    cout << endl;
}